

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlr.cc
# Opt level: O2

int64_t __thiscall dlr::DLR::GetShpaeSize(DLR *this,string *name)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  long *plVar4;
  
  iVar2 = tvm::runtime::GraphRuntime::GetInputIndex
                    ((this->tvm_graph_runtime_).
                     super___shared_ptr<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,name);
  lVar1 = (long)(((this->tvm_graph_runtime_).
                  super___shared_ptr<tvm::runtime::GraphRuntime,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->attrs_).shape.
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = 1;
  for (plVar4 = *(long **)(lVar1 + (long)iVar2 * 0x18);
      plVar4 != *(long **)(lVar1 + 8 + (long)iVar2 * 0x18); plVar4 = plVar4 + 1) {
    iVar3 = iVar3 * *plVar4;
  }
  return iVar3;
}

Assistant:

int64_t DLR::GetShpaeSize(const std::string &name) {
  int in_idx = tvm_graph_runtime_->GetInputIndex(name);
  size_t shape_size = 1;

  for (int64_t sz : tvm_graph_runtime_->attrs_.shape[in_idx])
    shape_size *= static_cast<size_t>(sz);

  return shape_size;
}